

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall higan::Socket::Bind(Socket *this)

{
  undefined8 uVar1;
  string local_360;
  Fmt local_340;
  Logger local_240;
  int local_24;
  undefined1 local_20 [4];
  int result;
  sockaddr addr;
  Socket *this_local;
  
  addr.sa_data._6_8_ = this;
  memset(local_20,0,0x10);
  InetAddress::GetSockaddr(&this->address_,(sockaddr *)local_20);
  local_24 = bind(this->fd_,(sockaddr *)local_20,0x10);
  if (local_24 == -1) {
    Logger::Logger(&local_240,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/Socket.cpp"
                   ,0x29,"Bind");
    InetAddress::GetIpPort_abi_cxx11_(&local_360,&this->address_);
    uVar1 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_340,"bind on %s error",uVar1);
    Logger::operator<<(&local_240,&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    Logger::~Logger(&local_240);
  }
  return;
}

Assistant:

void Socket::Bind()
{
	struct sockaddr addr{};
	address_.GetSockaddr(&addr);
	int result = bind(fd_, &addr, static_cast<socklen_t>(sizeof addr));

	if (result == -1)
	{
		LOG_FATAL << higan::Fmt("bind on %s error", address_.GetIpPort().c_str());
	}
}